

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcAssignVarIds(Bmc_Mna_t *p,Vec_Int_t *vIns,Vec_Int_t *vUsed,Vec_Int_t *vOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  for (iVar4 = 0; iVar4 < vIns->nSize; iVar4 = iVar4 + 1) {
    iVar2 = Vec_IntEntry(vIns,iVar4);
    iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
    if (iVar3 == 0) {
      iVar3 = p->nSatVars;
      p->nSatVars = iVar3 + 1;
      Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
    }
  }
  iVar4 = vUsed->nSize;
  while( true ) {
    if (iVar4 < 1) {
      iVar4 = 0;
      while( true ) {
        if (vOuts->nSize <= iVar4) {
          iVar4 = p->nSatVars;
          iVar2 = sat_solver_nvars(p->pSat);
          if (iVar2 < iVar4) {
            sat_solver_setnvars(p->pSat,p->nSatVars);
          }
          return iVar1;
        }
        iVar2 = Vec_IntEntry(vOuts,iVar4);
        iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
        if (iVar3 != 0) break;
        iVar3 = p->nSatVars;
        p->nSatVars = iVar3 + 1;
        Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
        iVar4 = iVar4 + 1;
      }
      __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0x1e0,
                    "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar4 = iVar4 + -1;
    iVar2 = Vec_IntEntry(vUsed,iVar4);
    iVar3 = Vec_IntEntry(p->vId2Var,iVar2);
    if (iVar3 != 0) break;
    iVar3 = p->nSatVars;
    p->nSatVars = iVar3 + 1;
    Vec_IntWriteEntry(p->vId2Var,iVar2,iVar3);
  }
  __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                ,0x1db,
                "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Gia_ManBmcAssignVarIds( Bmc_Mna_t * p, Vec_Int_t * vIns, Vec_Int_t * vUsed, Vec_Int_t * vOuts )
{
    int i, iObj = 0, VarC0 = p->nSatVars++;
    Vec_IntForEachEntry( vIns, iObj, i )
        if ( Vec_IntEntry( p->vId2Var, iObj ) == 0 )
            Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    Vec_IntForEachEntryReverse( vUsed, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    Vec_IntForEachEntry( vOuts, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    // extend the SAT solver
    if ( p->nSatVars > sat_solver_nvars(p->pSat) )
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return VarC0;
}